

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__cleanup_gathered_coefficients
               (stbir_edge edge,stbir__filter_extent_info *filter_info,stbir__scale_info *scale_info
               ,int num_contributors,stbir__contributors *contributors,float *coefficient_group,
               int coefficient_width)

{
  float fVar1;
  int iVar2;
  stbir_uint32 sVar3;
  stbir_uint32 sVar4;
  stbir__edge_wrap_func *psVar5;
  stbir_uint32 sVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  float *pfVar11;
  long lVar12;
  ulong uVar13;
  stbir_uint32 sVar14;
  uint uVar15;
  stbir__contributors *psVar16;
  int iVar17;
  ulong uVar18;
  float *pfVar19;
  long lVar20;
  bool bVar21;
  double dVar22;
  int local_7c;
  int local_78;
  
  iVar2 = scale_info->input_full_size;
  sVar3 = scale_info->scale_numerator;
  sVar4 = scale_info->scale_denominator;
  bVar21 = scale_info->scale_is_rational != 0;
  sVar6 = num_contributors;
  if ((int)sVar3 < num_contributors && bVar21) {
    sVar6 = sVar3;
  }
  lVar20 = (long)coefficient_width;
  if (0 < (int)sVar6) {
    sVar14 = 0;
    pfVar11 = coefficient_group;
    psVar16 = contributors;
    do {
      iVar17 = psVar16->n1 - psVar16->n0;
      if (iVar17 < 0) {
        dVar22 = 0.0;
      }
      else {
        dVar22 = 0.0;
        uVar18 = 0;
        do {
          if (2.0 < ABS(pfVar11[uVar18])) {
            __assert_fail("( coeffs[i] >= -2.0f ) && ( coeffs[i] <= 2.0f )",
                          "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/stb_image_resize2.h"
                          ,0xda7,
                          "void stbir__cleanup_gathered_coefficients(stbir_edge, stbir__filter_extent_info *, stbir__scale_info *, int, stbir__contributors *, float *, int)"
                         );
          }
          dVar22 = dVar22 + (double)pfVar11[uVar18];
          uVar18 = uVar18 + 1;
        } while (iVar17 + 1 != uVar18);
      }
      if (7.52316384526264e-37 <= ABS(dVar22)) {
        if ((dVar22 != 1.0) && (-1 < iVar17)) {
          uVar18 = 0;
          do {
            pfVar11[uVar18] = (float)((double)pfVar11[uVar18] * (1.0 / dVar22));
            uVar18 = uVar18 + 1;
          } while (iVar17 + 1 != uVar18);
        }
      }
      else {
        psVar16->n1 = psVar16->n0;
        *pfVar11 = 0.0;
      }
      psVar16 = psVar16 + 1;
      pfVar11 = pfVar11 + lVar20;
      sVar14 = sVar14 + 1;
    } while (sVar14 != sVar6);
  }
  if ((int)sVar3 < num_contributors && bVar21) {
    lVar12 = 0;
    do {
      contributors[(int)sVar3 + lVar12].n0 = contributors[lVar12].n0 + sVar4;
      contributors[(int)sVar3 + lVar12].n1 = contributors[lVar12].n1 + sVar4;
      lVar12 = lVar12 + 1;
    } while (num_contributors - sVar3 != (int)lVar12);
    iVar17 = sVar3 * coefficient_width;
    lVar12 = (long)(int)((num_contributors - sVar3) * coefficient_width);
    pfVar11 = coefficient_group;
    if (3 < iVar17) {
      uVar18 = lVar12 * 4;
      uVar13 = uVar18 & 0xfffffffffffffff0;
      do {
        uVar7 = *(undefined8 *)(pfVar11 + 2);
        *(undefined8 *)(pfVar11 + iVar17) = *(undefined8 *)pfVar11;
        *(undefined8 *)(pfVar11 + iVar17 + 2) = uVar7;
        pfVar11 = pfVar11 + 4;
        uVar18 = uVar18 - 0x10;
      } while (pfVar11 < (float *)(uVar13 + (long)coefficient_group));
      if (uVar18 == 0) goto LAB_0016a512;
    }
    do {
      pfVar11[iVar17] = *pfVar11;
      pfVar11 = pfVar11 + 1;
    } while (pfVar11 < coefficient_group + lVar12);
  }
LAB_0016a512:
  if (num_contributors < 1) {
    local_7c = 0x7fffffff;
    local_78 = -0x7fffffff;
    uVar15 = 0xffffffff;
  }
  else {
    pfVar11 = coefficient_group + iVar2;
    uVar15 = 0xffffffff;
    local_78 = -0x7fffffff;
    local_7c = 0x7fffffff;
    iVar17 = 0;
    do {
      if (edge == STBIR_EDGE_ZERO) {
        if (iVar2 <= contributors->n1) {
          contributors->n1 = iVar2 + -1;
        }
        iVar8 = contributors->n0;
        if (iVar8 < 0) {
          contributors->n0 = 0;
          uVar10 = contributors->n1;
          if (-1 < (int)uVar10) {
            lVar12 = 0;
            do {
              coefficient_group[lVar12] = coefficient_group[(int)lVar12 - iVar8];
              lVar12 = lVar12 + 1;
            } while ((ulong)uVar10 + 1 != lVar12);
          }
        }
      }
      else if (edge < STBIR_EDGE_WRAP) {
        uVar10 = contributors->n1;
        if (iVar2 <= (int)uVar10) {
          iVar8 = contributors->n0;
          contributors->n1 = iVar2 + -1;
          psVar5 = stbir__edge_wrap_slow[edge];
          lVar12 = 0;
          do {
            iVar9 = (*psVar5)(iVar2 + (int)lVar12,iVar2);
            stbir__insert_coeff(contributors,coefficient_group,iVar9,pfVar11[lVar12 - iVar8],
                                coefficient_width);
            lVar12 = lVar12 + 1;
          } while (~uVar10 + iVar2 + (int)lVar12 != 0);
        }
        if (contributors->n0 < 0) {
          pfVar19 = coefficient_group + (uint)~contributors->n0;
          iVar8 = contributors->n0;
          if (iVar8 < -1) {
            psVar5 = stbir__edge_wrap_slow[edge];
            iVar9 = -1;
            do {
              iVar8 = (*psVar5)(iVar9,iVar2);
              fVar1 = *pfVar19;
              pfVar19 = pfVar19 + -1;
              stbir__insert_coeff(contributors,coefficient_group,iVar8,fVar1,coefficient_width);
              iVar9 = iVar9 + -1;
              iVar8 = contributors->n0;
            } while (iVar8 < iVar9);
          }
          fVar1 = *pfVar19;
          contributors->n0 = 0;
          if (-1 < contributors->n1) {
            lVar12 = -1;
            do {
              coefficient_group[lVar12 + 1] = coefficient_group[(lVar12 + 1) - (long)iVar8];
              lVar12 = lVar12 + 1;
            } while (lVar12 < contributors->n1);
          }
          iVar8 = (*stbir__edge_wrap_slow[edge])(iVar8,iVar2);
          stbir__insert_coeff(contributors,coefficient_group,iVar8,fVar1,coefficient_width);
        }
      }
      iVar8 = contributors->n0;
      iVar9 = contributors->n1 - iVar8;
      if (iVar8 <= contributors->n1) {
        lVar12 = (long)(iVar9 + 1);
        uVar10 = iVar9 + 2;
        while (lVar12 = lVar12 + -1, lVar12 != -1) {
          uVar10 = uVar10 - 1;
          if ((coefficient_group[lVar12] != 0.0) || (NAN(coefficient_group[lVar12])))
          goto LAB_0016a781;
        }
        uVar10 = 0;
LAB_0016a781:
        iVar9 = iVar8 + uVar10 + -1;
        contributors->n1 = iVar9;
        if (0 < (int)uVar10) {
          if (iVar8 < local_7c) {
            local_7c = iVar8;
          }
          if (local_78 < iVar9) {
            local_78 = iVar9;
          }
          if ((int)uVar15 < (int)uVar10) {
            uVar15 = uVar10;
          }
        }
        if ((int)uVar10 < coefficient_width) {
          memset(coefficient_group + (int)uVar10,0,(ulong)(~uVar10 + coefficient_width) * 4 + 4);
        }
      }
      contributors = contributors + 1;
      coefficient_group = coefficient_group + lVar20;
      iVar17 = iVar17 + 1;
      pfVar11 = pfVar11 + lVar20;
    } while (iVar17 != num_contributors);
  }
  filter_info->lowest = local_7c;
  filter_info->highest = local_78;
  filter_info->widest = uVar15;
  return;
}

Assistant:

static void stbir__cleanup_gathered_coefficients( stbir_edge edge, stbir__filter_extent_info* filter_info, stbir__scale_info * scale_info, int num_contributors, stbir__contributors* contributors, float * coefficient_group, int coefficient_width )
{
  int input_size = scale_info->input_full_size;
  int input_last_n1 = input_size - 1;
  int n, end;
  int lowest = 0x7fffffff;
  int highest = -0x7fffffff;
  int widest = -1;
  int numerator = scale_info->scale_numerator;
  int denominator = scale_info->scale_denominator;
  int polyphase = ( ( scale_info->scale_is_rational ) && ( numerator < num_contributors ) );
  float * coeffs;
  stbir__contributors * contribs;

  // weight all the coeffs for each sample
  coeffs = coefficient_group;
  contribs = contributors;
  end = num_contributors; if ( polyphase ) end = numerator;
  for (n = 0; n < end; n++)
  {
    int i;
    STBIR_RENORM_TYPE filter_scale, total_filter = 0;
    int e;

    // add all contribs
    e = contribs->n1 - contribs->n0;
    for( i = 0 ; i <= e ; i++ )
    {
      total_filter += (STBIR_RENORM_TYPE) coeffs[i];
      STBIR_ASSERT( ( coeffs[i] >= -2.0f ) && ( coeffs[i] <= 2.0f )  ); // check for wonky weights
    }

    // rescale
    if ( ( total_filter < stbir__small_float ) && ( total_filter > -stbir__small_float ) )
    {
      // all coeffs are extremely small, just zero it
      contribs->n1 = contribs->n0;
      coeffs[0] = 0.0f;
    }
    else
    {
      // if the total isn't 1.0, rescale everything
      if ( ( total_filter < (1.0f-stbir__small_float) ) || ( total_filter > (1.0f+stbir__small_float) ) )
      {
        filter_scale = ((STBIR_RENORM_TYPE)1.0) / total_filter;

        // scale them all
        for (i = 0; i <= e; i++)
          coeffs[i] = (float) ( coeffs[i] * filter_scale );
      }
    }
    ++contribs;
    coeffs += coefficient_width;
  }

  // if we have a rational for the scale, we can exploit the polyphaseness to not calculate
  //   most of the coefficients, so we copy them here
  if ( polyphase )
  {
    stbir__contributors * prev_contribs = contributors;
    stbir__contributors * cur_contribs = contributors + numerator;

    for( n = numerator ; n < num_contributors ; n++ )
    {
      cur_contribs->n0 = prev_contribs->n0 + denominator;
      cur_contribs->n1 = prev_contribs->n1 + denominator;
      ++cur_contribs;
      ++prev_contribs;
    }
    stbir_overlapping_memcpy( coefficient_group + numerator * coefficient_width, coefficient_group, ( num_contributors - numerator ) * coefficient_width * sizeof( coeffs[ 0 ] ) );
  }

  coeffs = coefficient_group;
  contribs = contributors;

  for (n = 0; n < num_contributors; n++)
  {
    int i;

    // in zero edge mode, just remove out of bounds contribs completely (since their weights are accounted for now)
    if ( edge == STBIR_EDGE_ZERO )
    {
      // shrink the right side if necessary
      if ( contribs->n1 > input_last_n1 )
        contribs->n1 = input_last_n1;

      // shrink the left side
      if ( contribs->n0 < 0 )
      {
        int j, left, skips = 0;

        skips = -contribs->n0;
        contribs->n0 = 0;

        // now move down the weights
        left = contribs->n1 - contribs->n0 + 1;
        if ( left > 0 )
        {
          for( j = 0 ; j < left ; j++ )
            coeffs[ j ] = coeffs[ j + skips ];
        }
      }
    }
    else if ( ( edge == STBIR_EDGE_CLAMP ) || ( edge == STBIR_EDGE_REFLECT ) )
    {
      // for clamp and reflect, calculate the true inbounds position (based on edge type) and just add that to the existing weight

      // right hand side first
      if ( contribs->n1 > input_last_n1 )
      {
        int start = contribs->n0;
        int endi = contribs->n1;
        contribs->n1 = input_last_n1;
        for( i = input_size; i <= endi; i++ )
          stbir__insert_coeff( contribs, coeffs, stbir__edge_wrap_slow[edge]( i, input_size ), coeffs[i-start], coefficient_width );
      }

      // now check left hand edge
      if ( contribs->n0 < 0 )
      {
        int save_n0;
        float save_n0_coeff;
        float * c = coeffs - ( contribs->n0 + 1 );

        // reinsert the coeffs with it reflected or clamped (insert accumulates, if the coeffs exist)
        for( i = -1 ; i > contribs->n0 ; i-- )
          stbir__insert_coeff( contribs, coeffs, stbir__edge_wrap_slow[edge]( i, input_size ), *c--, coefficient_width );
        save_n0 = contribs->n0;
        save_n0_coeff = c[0]; // save it, since we didn't do the final one (i==n0), because there might be too many coeffs to hold (before we resize)!

        // now slide all the coeffs down (since we have accumulated them in the positive contribs) and reset the first contrib
        contribs->n0 = 0;
        for(i = 0 ; i <= contribs->n1 ; i++ )
          coeffs[i] = coeffs[i-save_n0];

        // now that we have shrunk down the contribs, we insert the first one safely
        stbir__insert_coeff( contribs, coeffs, stbir__edge_wrap_slow[edge]( save_n0, input_size ), save_n0_coeff, coefficient_width );
      }
    }

    if ( contribs->n0 <= contribs->n1 )
    {
      int diff = contribs->n1 - contribs->n0 + 1;
      while ( diff && ( coeffs[ diff-1 ] == 0.0f ) )
        --diff;

      contribs->n1 = contribs->n0 + diff - 1;

      if ( contribs->n0 <= contribs->n1 )
      {
        if ( contribs->n0 < lowest )
          lowest = contribs->n0;
        if ( contribs->n1 > highest )
          highest = contribs->n1;
        if ( diff > widest )
          widest = diff;
      }

      // re-zero out unused coefficients (if any)
      for( i = diff ; i < coefficient_width ; i++ )
        coeffs[i] = 0.0f;
    }

    ++contribs;
    coeffs += coefficient_width;
  }
  filter_info->lowest = lowest;
  filter_info->highest = highest;
  filter_info->widest = widest;
}